

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIsDerivedFromBuiltInType(xmlSchemaTypePtr type,int valType)

{
  int valType_local;
  xmlSchemaTypePtr type_local;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    type_local._4_4_ = 0;
  }
  else if ((type->type == XML_SCHEMA_TYPE_COMPLEX) || (type->builtInType == 0x2d)) {
    type_local._4_4_ = 0;
  }
  else if (type->type == XML_SCHEMA_TYPE_BASIC) {
    if (type->builtInType == valType) {
      type_local._4_4_ = 1;
    }
    else if ((type->builtInType == 0x2e) || (type->builtInType == 0x2d)) {
      type_local._4_4_ = 0;
    }
    else {
      type_local._4_4_ = xmlSchemaIsDerivedFromBuiltInType(type->subtypes,valType);
    }
  }
  else {
    type_local._4_4_ = xmlSchemaIsDerivedFromBuiltInType(type->subtypes,valType);
  }
  return type_local._4_4_;
}

Assistant:

static int
xmlSchemaIsDerivedFromBuiltInType(xmlSchemaTypePtr type, int valType)
{
    if (type == NULL)
	return (0);
    if (WXS_IS_COMPLEX(type))
	return (0);
    if (type->type == XML_SCHEMA_TYPE_BASIC) {
	if (type->builtInType == valType)
	    return(1);
	if ((type->builtInType == XML_SCHEMAS_ANYSIMPLETYPE) ||
	    (type->builtInType == XML_SCHEMAS_ANYTYPE))
	    return (0);
	return(xmlSchemaIsDerivedFromBuiltInType(type->subtypes, valType));
    }
    return(xmlSchemaIsDerivedFromBuiltInType(type->subtypes, valType));
}